

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O3

int __thiscall
ir_function::accept(ir_function *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  exec_node *peVar1;
  int iVar2;
  int iVar3;
  exec_node *peVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  exec_node *peVar6;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar2 = (**(code **)(*plVar5 + 0x60))(plVar5,this);
  if (iVar2 != 0) {
    iVar3 = 0;
    if (iVar2 != 1) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  peVar6 = (this->signatures).head_sentinel.next;
  peVar1 = peVar6->next;
  if (peVar1 != (exec_node *)0x0) {
    while( true ) {
      peVar4 = peVar1;
      peVar1 = peVar4->next;
      iVar2 = (*(code *)peVar6[-1].prev[1].prev)(&peVar6[-1].prev,plVar5);
      if (iVar2 != 0) break;
      if (peVar1 == (exec_node *)0x0) goto LAB_001e2078;
      peVar1 = peVar4->next;
      peVar6 = peVar4;
    }
    if (iVar2 == 2) {
      return 2;
    }
  }
LAB_001e2078:
  iVar2 = (**(code **)(*plVar5 + 0x68))(plVar5,this);
  return iVar2;
}

Assistant:

ir_visitor_status
ir_function::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   s = visit_list_elements(v, &this->signatures, false);
   return (s == visit_stop) ? s : v->visit_leave(this);
}